

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selector_node.cpp
# Opt level: O0

void __thiscall
selector_node_double_true_Test::~selector_node_double_true_Test
          (selector_node_double_true_Test *this)

{
  selector_node_double_true_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(selector_node, double_true) {
  test_generator gen;
  auto root = gen.generate(
    "<bhvr_tree class = \"selector_node\">"
      "<bhvr_tree class = \"true_node\"/>"
      "<bhvr_tree class = \"true_node\"/>"
    "</bhvr_tree>"
  );
  ASSERT_NE(nullptr, root);

  test_agent agent;
  EXPECT_EQ(0, agent.get_true_counter());
  EXPECT_EQ(0, agent.get_false_counter());

  test_agent_proxy ap(agent);
  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_TRUE(result);
    EXPECT_EQ(1, agent->get_true_counter());
    EXPECT_EQ(0, agent->get_false_counter());
  });
}